

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O3

int cmp_ok_at_loc(char *file,int line,int a,char *op,int b,char *fmt,...)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char in_AL;
  uint uVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (op == "||") {
LAB_001045b7:
    uVar4 = b | a;
LAB_001045bf:
    uVar4 = (uint)(uVar4 != 0);
    goto LAB_001049bb;
  }
  if (op == (char *)0x0) {
LAB_0010497f:
    uVar4 = 0;
    diag("unrecognized operator \'%s\'",op);
    goto LAB_001049bb;
  }
  cVar1 = *op;
  if (cVar1 == '|') {
    if ((op[1] == '|') && (op[2] == '\0')) goto LAB_001045b7;
    if (op != "&&") {
LAB_001045fe:
      bVar2 = false;
LAB_00104600:
      if (op == "|") {
LAB_00104625:
        uVar4 = b | a;
      }
      else {
        if (cVar1 == '|') {
          if (op[1] == '\0') goto LAB_00104625;
          if (op != "^") goto LAB_00104647;
        }
        else if ((op != "^") && ((cVar1 != '^' || (op[1] != '\0')))) {
LAB_00104647:
          if ((op == "&") || ((bVar2 && (op[1] == '\0')))) {
            uVar4 = b & a;
            goto LAB_001049bb;
          }
          if (op != "==") {
            if (cVar1 != '=') {
              if (op != "!=") {
                if ((cVar1 != '!') || (op[1] != '=')) goto LAB_001046ea;
                if (op[2] != '\0') {
                  if (op == "<") goto LAB_0010471c;
                  if (op == ">") goto LAB_00104748;
LAB_00104757:
                  bVar2 = false;
LAB_00104759:
                  bVar3 = false;
LAB_0010475b:
                  if ((op == "<=") || (((bVar2 && (op[1] == '=')) && (op[2] == '\0')))) {
                    uVar4 = (uint)(a <= b);
                    goto LAB_001049bb;
                  }
                  if ((op == ">=") || (((bVar3 && (op[1] == '=')) && (op[2] == '\0')))) {
                    uVar4 = (uint)(b <= a);
                    goto LAB_001049bb;
                  }
                  if ((op == "<<") || (((bVar2 && (op[1] == '<')) && (op[2] == '\0')))) {
                    uVar4 = a << ((byte)b & 0x1f);
                    goto LAB_001049bb;
                  }
                  if ((op == ">>") || (((bVar3 && (op[1] == '>')) && (op[2] == '\0')))) {
                    uVar4 = a >> ((byte)b & 0x1f);
                    goto LAB_001049bb;
                  }
                  if (op == "+") {
LAB_00104857:
                    uVar4 = b + a;
                  }
                  else {
                    if (cVar1 == '+') {
                      if (op[1] == '\0') goto LAB_00104857;
                      if (op != "-") {
LAB_0010489b:
                        if (op == "*") goto LAB_00104919;
LAB_001048dc:
                        if (op == "/") {
LAB_00104931:
                          uVar4 = a / b;
                        }
                        else {
                          if (cVar1 == '/') {
                            if (op[1] == '\0') goto LAB_00104931;
LAB_001048f6:
                            if (op != "%") goto LAB_0010497f;
                          }
                          else if ((op != "%") && ((cVar1 != '%' || (op[1] != '\0'))))
                          goto LAB_0010497f;
                          uVar4 = a % b;
                        }
                        goto LAB_001049bb;
                      }
                    }
                    else if (op != "-") {
                      if (cVar1 != '-') {
                        if (op != "*") {
                          if (cVar1 != '*') goto LAB_001048dc;
                          if (op[1] != '\0') {
                            if (op != "/") goto LAB_001048f6;
                            goto LAB_00104931;
                          }
                        }
LAB_00104919:
                        uVar4 = b * a;
                        goto LAB_001049bb;
                      }
                      if (op[1] != '\0') goto LAB_0010489b;
                    }
                    uVar4 = a - b;
                  }
                  goto LAB_001049bb;
                }
              }
LAB_00104711:
              uVar4 = a - b;
              goto LAB_001045bf;
            }
            if ((op[1] != '=') || (op[2] != '\0')) {
              if (op == "!=") goto LAB_00104711;
LAB_001046ea:
              if (op == "<") {
LAB_0010471c:
                uVar4 = (uint)(a < b);
              }
              else {
                if (cVar1 == '<') {
                  if (op[1] == '\0') goto LAB_0010471c;
                  if (op != ">") {
                    bVar2 = true;
                    goto LAB_00104759;
                  }
                }
                else if (op != ">") {
                  if (cVar1 != '>') goto LAB_00104757;
                  if (op[1] != '\0') {
                    bVar3 = true;
                    bVar2 = false;
                    goto LAB_0010475b;
                  }
                }
LAB_00104748:
                uVar4 = (uint)(b < a);
              }
              goto LAB_001049bb;
            }
          }
          uVar4 = (uint)(a == b);
          goto LAB_001049bb;
        }
        uVar4 = b ^ a;
      }
      goto LAB_001049bb;
    }
  }
  else if (op != "&&") {
    if (cVar1 != '&') goto LAB_001045fe;
    bVar2 = true;
    if ((op[1] != '&') || (op[2] != '\0')) goto LAB_00104600;
  }
  uVar4 = (uint)(b != 0 && a != 0);
LAB_001049bb:
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &stack0x00000008;
  local_108.gp_offset = 0x30;
  local_108.fp_offset = 0x30;
  vok_at_loc(file,line,uVar4,fmt,&local_108);
  if (uVar4 == 0) {
    diag("    %d",(ulong)(uint)a);
    diag("        %s",op);
    diag("    %d",(ulong)(uint)b);
  }
  return uVar4;
}

Assistant:

int
cmp_ok_at_loc (const char *file, int line, int a, const char *op, int b,
               const char *fmt, ...)
{
    int test = eq(op, "||") ? a || b
             : eq(op, "&&") ? a && b
             : eq(op, "|")  ? a |  b
             : eq(op, "^")  ? a ^  b
             : eq(op, "&")  ? a &  b
             : eq(op, "==") ? a == b
             : eq(op, "!=") ? a != b
             : eq(op, "<")  ? a <  b
             : eq(op, ">")  ? a >  b
             : eq(op, "<=") ? a <= b
             : eq(op, ">=") ? a >= b
             : eq(op, "<<") ? a << b
             : eq(op, ">>") ? a >> b
             : eq(op, "+")  ? a +  b
             : eq(op, "-")  ? a -  b
             : eq(op, "*")  ? a *  b
             : eq(op, "/")  ? a /  b
             : eq(op, "%")  ? a %  b
             : diag("unrecognized operator '%s'", op);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        diag("    %d", a);
        diag("        %s", op);
        diag("    %d", b);
    }
    return test;
}